

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainFunc __thiscall kj::MainBuilder::build(MainBuilder *this)

{
  Own<kj::MainBuilder::Impl,_std::nullptr_t> *impl;
  Iface *extraout_RDX;
  Own<kj::MainBuilder::Impl,_std::nullptr_t> *in_RSI;
  MainFunc MVar1;
  MainImpl local_28;
  MainBuilder *this_local;
  
  this_local = this;
  impl = mv<kj::Own<kj::MainBuilder::Impl,decltype(nullptr)>>(in_RSI);
  MainImpl::MainImpl(&local_28,impl);
  Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>::
  Function<kj::MainBuilder::MainImpl>
            ((Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)> *)this,&local_28);
  MainImpl::~MainImpl(&local_28);
  MVar1.impl.ptr = extraout_RDX;
  MVar1.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar1.impl;
}

Assistant:

MainFunc MainBuilder::build() {
  return MainImpl(kj::mv(impl));
}